

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.hpp
# Opt level: O0

void __thiscall
cs::domain_manager::add_var_no_return<char_const(&)[35]>
          (domain_manager *this,char (*name) [35],var *val)

{
  bool bVar1;
  byte bVar2;
  undefined8 uVar3;
  domain_type *name_00;
  runtime_error *this_00;
  domain_type *in_RSI;
  undefined8 *in_RDI;
  string *in_stack_fffffffffffffe38;
  runtime_error *in_stack_fffffffffffffe40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe48;
  undefined8 in_stack_fffffffffffffe50;
  undefined1 override;
  allocator *paVar4;
  undefined6 in_stack_fffffffffffffe58;
  undefined1 in_stack_fffffffffffffe5e;
  undefined1 in_stack_fffffffffffffe5f;
  string *in_stack_fffffffffffffe60;
  domain_type *in_stack_fffffffffffffe68;
  domain_type *pdVar5;
  stack_type<cs::domain_type,_std::allocator> *in_stack_fffffffffffffe80;
  allocator local_141;
  string local_140 [103];
  allocator local_d9;
  string local_d8 [38];
  undefined1 local_b2;
  allocator local_b1;
  string local_b0 [119];
  allocator local_39;
  string local_38 [40];
  domain_type *local_10;
  
  override = (undefined1)((ulong)in_stack_fffffffffffffe50 >> 0x38);
  local_10 = in_RSI;
  if (*(long *)*in_RDI == 0) {
    name_00 = stack_type<cs::domain_type,_std::allocator>::top(in_stack_fffffffffffffe80);
    pdVar5 = local_10;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d8,(char *)pdVar5,&local_d9);
    bVar1 = domain_type::add_var_optimal
                      (pdVar5,(string *)name_00,
                       (var *)CONCAT17(in_stack_fffffffffffffe5f,
                                       CONCAT16(in_stack_fffffffffffffe5e,in_stack_fffffffffffffe58)
                                      ),(bool)override);
    bVar2 = bVar1 ^ 0xff;
    std::__cxx11::string::~string(local_d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_d9);
    if ((bVar2 & 1) != 0) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x28);
      paVar4 = &local_141;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_140,(char *)local_10,paVar4);
      std::operator+((char *)local_10,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_10,
                     (char *)this_00);
      runtime_error::runtime_error(this_00,in_stack_fffffffffffffe38);
      __cxa_throw(this_00,&runtime_error::typeinfo,runtime_error::~runtime_error);
    }
  }
  else {
    stack_type<cs::domain_type,_std::allocator>::top(in_stack_fffffffffffffe80);
    pdVar5 = local_10;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,(char *)pdVar5,&local_39);
    bVar1 = domain_type::add_var_optimal
                      (in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,
                       (var *)CONCAT17(in_stack_fffffffffffffe5f,
                                       CONCAT16(in_stack_fffffffffffffe5e,in_stack_fffffffffffffe58)
                                      ),(bool)override);
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      local_b2 = 1;
      uVar3 = __cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_b0,(char *)local_10,&local_b1);
      std::operator+((char *)in_stack_fffffffffffffe48,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffe40);
      std::operator+(in_stack_fffffffffffffe48,(char *)in_stack_fffffffffffffe40);
      runtime_error::runtime_error(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
      local_b2 = 0;
      __cxa_throw(uVar3,&runtime_error::typeinfo,runtime_error::~runtime_error);
    }
  }
  return;
}

Assistant:

void add_var_no_return(T &&name, const var &val)
		{
			if (fiber_stack != nullptr) {
				if (!fiber_stack->top().add_var_optimal(name, val))
					throw runtime_error("Target domain exist variable \"" + std::string(name) + "\".");
			}
			else {
				if (!m_data.top().add_var_optimal(name, val))
					throw runtime_error("Target domain exist variable \"" + std::string(name) + "\".");
			}
		}